

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Signal_PDU::~Signal_PDU(Signal_PDU *this)

{
  pointer pcVar1;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_0021b7d0;
  pcVar1 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_vData).super__Vector_base<char,_std::allocator<char>_>);
  DATA_TYPE::EncodingScheme::~EncodingScheme(&this->m_EncodingScheme);
  Radio_Communications_Header::~Radio_Communications_Header
            (&this->super_Radio_Communications_Header);
  return;
}

Assistant:

Signal_PDU::~Signal_PDU()
{
    m_vData.clear();
}